

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64_unit.cpp
# Opt level: O0

void anon_unknown.dwarf_41e4::test_remove_bulk(void **param_1)

{
  roaring64_bitmap_t *val;
  roaring64_bulk_context_t *in_RDI;
  uint64_t i_2;
  uint64_t i_1;
  uint64_t i;
  roaring64_bulk_context_t context;
  roaring64_bitmap_t *r;
  undefined8 in_stack_ffffffffffffffa8;
  int line;
  ulong uVar1;
  roaring64_bitmap_t *in_stack_ffffffffffffffb0;
  char *expression;
  ulong result;
  uint64_t in_stack_ffffffffffffffc8;
  uint64_t in_stack_ffffffffffffffd0;
  roaring64_bulk_context_t *context_00;
  roaring64_bitmap_t *r_00;
  roaring64_bitmap_t *in_stack_ffffffffffffffe0;
  
  val = roaring64_bitmap_create();
  memset(&stack0xffffffffffffffe0,0,0x10);
  for (r_00 = (roaring64_bitmap_t *)0x0; r_00 < (roaring64_bitmap_t *)0x2710;
      r_00 = (roaring64_bitmap_t *)((long)&(r_00->art).root + 1)) {
    roaring64_bitmap_add_bulk
              (in_stack_ffffffffffffffe0,(roaring64_bulk_context_t *)r_00,in_stack_ffffffffffffffd0)
    ;
  }
  memset(&stack0xffffffffffffffc8,0,6);
  context_00 = (roaring64_bulk_context_t *)0x0;
  for (result = 1; line = (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20), result < 9999;
      result = result + 1) {
    roaring64_bitmap_remove_bulk((roaring64_bitmap_t *)i_2,in_RDI,(uint64_t)val);
    assert_r64_valid(in_stack_ffffffffffffffb0);
  }
  memset(&stack0xffffffffffffffb0,0,6);
  expression = (char *)0x0;
  roaring64_bitmap_contains_bulk(r_00,context_00,in_stack_ffffffffffffffc8);
  _assert_true(result,expression,(char *)in_stack_ffffffffffffffb0,line);
  for (uVar1 = 1; uVar1 < 9999; uVar1 = uVar1 + 1) {
    roaring64_bitmap_contains_bulk(r_00,context_00,in_stack_ffffffffffffffc8);
    _assert_true(result,expression,(char *)in_stack_ffffffffffffffb0,(int)(uVar1 >> 0x20));
  }
  roaring64_bitmap_contains_bulk(r_00,context_00,in_stack_ffffffffffffffc8);
  _assert_true(result,expression,(char *)in_stack_ffffffffffffffb0,(int)(uVar1 >> 0x20));
  roaring64_bitmap_free((roaring64_bitmap_t *)context.leaf);
  return;
}

Assistant:

DEFINE_TEST(test_remove_bulk) {
    roaring64_bitmap_t* r = roaring64_bitmap_create();
    roaring64_bulk_context_t context{};
    for (uint64_t i = 0; i < 10000; ++i) {
        roaring64_bitmap_add_bulk(r, &context, i * 1000);
    }
    context = {};
    for (uint64_t i = 1; i < 9999; ++i) {
        roaring64_bitmap_remove_bulk(r, &context, i * 1000);
        assert_r64_valid(r);
    }
    context = {};
    assert_true(roaring64_bitmap_contains_bulk(r, &context, 0));
    for (uint64_t i = 1; i < 9999; ++i) {
        assert_false(roaring64_bitmap_contains_bulk(r, &context, i * 1000));
    }
    assert_true(roaring64_bitmap_contains_bulk(r, &context, 9999000));
    roaring64_bitmap_free(r);
}